

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>::operator()
          (bin_writer<3> *this,counting_iterator<char> *it)

{
  bool in_R9B;
  counting_iterator<char> cVar1;
  
  cVar1.count_ = (ulong)*(uint *)&it->blackhole_;
  cVar1._8_8_ = *(undefined8 *)this;
  cVar1 = internal::format_uint<3u,char,fmt::v5::internal::counting_iterator<char>,unsigned_long>
                    ((internal *)it->count_,cVar1,(ulong)*(uint *)(this + 8),0,in_R9B);
  it->count_ = cVar1.count_;
  it->blackhole_ = cVar1.blackhole_;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }